

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O3

int __thiscall jpgd::jpeg_decoder::huff_decode(jpeg_decoder *this,huff_tables *pH,int *extra_bits)

{
  uint uVar1;
  uint num_bits;
  uint num_bits_00;
  uint uVar2;
  uint uVar3;
  
  uVar3 = pH->look_up2[this->m_bit_buf >> 0x18];
  if ((int)uVar3 < 0) {
    uVar2 = 0xfffffff8;
    do {
      uVar2 = uVar2 - 1;
      uVar3 = pH->tree[-(uint)((this->m_bit_buf >> (uVar2 & 0x1f) & 1) != 0) - uVar3];
    } while ((int)uVar3 < 0);
    get_bits_no_markers(this,-uVar2);
    uVar1 = get_bits_no_markers(this,uVar3 & 0xf);
    uVar2 = uVar3;
  }
  else {
    num_bits = uVar3 >> 8 & 0x1f;
    uVar2 = uVar3 & 0xff;
    num_bits_00 = uVar3 & 0xf;
    if (num_bits != ((uint)(int)(short)uVar3 >> 0xf & num_bits_00) + (uint)pH->code_size[uVar2]) {
      __assert_fail("((symbol >> 8) & 31) == pH->code_size[symbol & 255] + ((symbol & 0x8000) ? (symbol & 15) : 0)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/shuai132[P]usbcam/jpgd.cpp"
                    ,0x219,"int jpgd::jpeg_decoder::huff_decode(huff_tables *, int &)");
    }
    if ((short)uVar3 < 0) {
      get_bits_no_markers(this,num_bits);
      uVar1 = uVar3 >> 0x10;
    }
    else if (this->m_bits_left + 0x10 < (int)(num_bits + num_bits_00)) {
      get_bits_no_markers(this,num_bits);
      uVar1 = get_bits_no_markers(this,num_bits_00);
    }
    else {
      uVar1 = get_bits_no_markers(this,num_bits + num_bits_00);
      uVar1 = ~(-1 << (sbyte)num_bits_00) & uVar1;
    }
  }
  *extra_bits = uVar1;
  return uVar2;
}

Assistant:

inline int jpeg_decoder::huff_decode(huff_tables *pH, int& extra_bits)
{
  int symbol;

  // Check first 8-bits: do we have a complete symbol?
  if ((symbol = pH->look_up2[m_bit_buf >> 24]) < 0)
  {
    // Use a tree traversal to find symbol.
    int ofs = 23;
    do
    {
      symbol = pH->tree[-(int)(symbol + ((m_bit_buf >> ofs) & 1))];
      ofs--;
    } while (symbol < 0);

    get_bits_no_markers(8 + (23 - ofs));

    extra_bits = get_bits_no_markers(symbol & 0xF);
  }
  else
  {
    JPGD_ASSERT(((symbol >> 8) & 31) == pH->code_size[symbol & 255] + ((symbol & 0x8000) ? (symbol & 15) : 0));

    if (symbol & 0x8000)
    {
      get_bits_no_markers((symbol >> 8) & 31);
      extra_bits = symbol >> 16;
    }
    else
    {
      int code_size = (symbol >> 8) & 31;
      int num_extra_bits = symbol & 0xF;
      int bits = code_size + num_extra_bits;
      if (bits <= (m_bits_left + 16))
        extra_bits = get_bits_no_markers(bits) & ((1 << num_extra_bits) - 1);
      else
      {
        get_bits_no_markers(code_size);
        extra_bits = get_bits_no_markers(num_extra_bits);
      }
    }

    symbol &= 0xFF;
  }

  return symbol;
}